

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ms_gauden.c
# Opt level: O2

int32 gauden_param_read(vector_t ****out_param,int32 *out_n_mgau,int32 *out_n_feat,
                       int32 *out_n_density,int32 **out_veclen,char *file_name)

{
  bool bVar1;
  vector_t ****pppppfVar2;
  int32 iVar3;
  int iVar4;
  uint uVar5;
  FILE *pFVar6;
  int32 *buf;
  ulong uVar7;
  vector_t ***ppppfVar8;
  vector_t buf_00;
  ulong uVar9;
  size_t sVar10;
  ulong uVar11;
  char *pcVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  int32 n_feat;
  int32 byteswap;
  uint32 chksum;
  char *local_88;
  int32 n_density;
  int32 n_mgau;
  int32 n;
  char tmp;
  char **argval;
  char **argname;
  int32 *local_60;
  int32 **local_58;
  int32 *local_50;
  int32 *local_48;
  vector_t ****local_40;
  FILE *local_38;
  
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/ms_gauden.c"
          ,0xd5,"Reading mixture gaussian parameter: %s\n",file_name);
  local_88 = file_name;
  pFVar6 = fopen(file_name,"rb");
  if (pFVar6 == (FILE *)0x0) {
    err_msg_system(ERR_FATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/ms_gauden.c"
                   ,0xd8,"fopen(%s,rb) failed\n",local_88);
  }
  else {
    local_60 = out_n_density;
    local_58 = out_veclen;
    local_50 = out_n_feat;
    local_48 = out_n_mgau;
    local_40 = out_param;
    local_38 = pFVar6;
    iVar3 = bio_readhdr((FILE *)pFVar6,&argname,&argval,&byteswap);
    if (iVar3 < 0) {
      pcVar12 = "bio_readhdr(%s) failed\n";
      lVar16 = 0xdc;
    }
    else {
      bVar1 = false;
      for (lVar16 = 0; pcVar12 = *(char **)((long)argname + lVar16), pcVar12 != (char *)0x0;
          lVar16 = lVar16 + 8) {
        iVar4 = strcmp(pcVar12,"version");
        if (iVar4 == 0) {
          pcVar12 = *(char **)((long)argval + lVar16);
          iVar4 = strcmp(pcVar12,"1.0");
          if (iVar4 != 0) {
            err_msg(ERR_WARN,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/ms_gauden.c"
                    ,0xe4,"Version mismatch(%s): %s, expecting %s\n",local_88,pcVar12,"1.0");
          }
        }
        else {
          iVar4 = strcmp(pcVar12,"chksum0");
          if (iVar4 == 0) {
            bVar1 = true;
          }
        }
      }
      bio_hdrarg_free(argname,argval);
      pFVar6 = local_38;
      argval = (char **)0x0;
      argname = (char **)0x0;
      chksum = 0;
      iVar3 = bio_fread(&n_mgau,4,1,(FILE *)local_38,byteswap,&chksum);
      if (iVar3 == 1) {
        *local_48 = n_mgau;
        iVar3 = bio_fread(&n_feat,4,1,(FILE *)pFVar6,byteswap,&chksum);
        pppppfVar2 = local_40;
        if (iVar3 == 1) {
          *local_50 = n_feat;
          iVar3 = bio_fread(&n_density,4,1,(FILE *)pFVar6,byteswap,&chksum);
          if (iVar3 == 1) {
            *local_60 = n_density;
            buf = (int32 *)__ckd_calloc__((long)n_feat,4,
                                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/ms_gauden.c"
                                          ,0x100);
            *local_58 = buf;
            uVar5 = bio_fread(buf,4,n_feat,(FILE *)pFVar6,byteswap,&chksum);
            if (uVar5 == n_feat) {
              uVar11 = 0;
              uVar7 = (ulong)uVar5;
              if ((int)uVar5 < 1) {
                uVar7 = uVar11;
              }
              uVar13 = 0;
              for (; uVar7 != uVar11; uVar11 = uVar11 + 1) {
                uVar13 = (ulong)(uint)((int)uVar13 + buf[uVar11]);
              }
              iVar3 = bio_fread(&n,4,1,(FILE *)pFVar6,byteswap,&chksum);
              if (iVar3 == 1) {
                if (n != n_mgau * (int)uVar13 * n_density) {
                  err_msg(ERR_FATAL,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/ms_gauden.c"
                          ,0x110,"%s: #float32s(%d) doesn\'t match dimensions: %d x %d x %d\n",
                          local_88,(ulong)(uint)n,(long)n_mgau,(long)n_density,uVar13);
                  goto LAB_001165f4;
                }
                ppppfVar8 = *pppppfVar2;
                if (ppppfVar8 == (vector_t ***)0x0) {
                  ppppfVar8 = (vector_t ***)
                              __ckd_calloc_3d__((long)n_mgau,(long)n_feat,(long)n_density,8,
                                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/ms_gauden.c"
                                                ,0x116);
                  buf_00 = (vector_t)
                           __ckd_calloc__((long)n,4,
                                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/ms_gauden.c"
                                          ,0x117);
                  uVar11 = 0;
                  uVar7 = (ulong)(uint)n_density;
                  if (n_density < 1) {
                    uVar7 = uVar11;
                  }
                  uVar13 = (ulong)(uint)n_feat;
                  if (n_feat < 1) {
                    uVar13 = uVar11;
                  }
                  uVar9 = (ulong)(uint)n_mgau;
                  if (n_mgau < 1) {
                    uVar9 = uVar11;
                  }
                  iVar4 = 0;
                  for (; uVar11 != uVar9; uVar11 = uVar11 + 1) {
                    for (uVar14 = 0; uVar14 != uVar13; uVar14 = uVar14 + 1) {
                      for (uVar15 = 0; uVar7 != uVar15; uVar15 = uVar15 + 1) {
                        ppppfVar8[uVar11][uVar14][uVar15] = buf_00 + iVar4;
                        iVar4 = iVar4 + buf[uVar14];
                      }
                    }
                  }
                }
                else {
                  buf_00 = ***ppppfVar8;
                }
                iVar3 = bio_fread(buf_00,4,n,(FILE *)pFVar6,byteswap,&chksum);
                if (iVar3 == n) {
                  if (bVar1) {
                    bio_verify_chksum((FILE *)pFVar6,byteswap,chksum);
                  }
                  sVar10 = fread(&tmp,1,1,pFVar6);
                  if (sVar10 != 1) {
                    fclose(pFVar6);
                    *pppppfVar2 = ppppfVar8;
                    err_msg(ERR_INFO,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/ms_gauden.c"
                            ,0x135,"%d codebook, %d feature, size\n",(ulong)(uint)n_mgau,
                            (ulong)(uint)n_feat);
                    for (lVar16 = 0; lVar16 < n_feat; lVar16 = lVar16 + 1) {
                      printf(" %dx%d",(ulong)(uint)n_density,(ulong)(uint)buf[lVar16]);
                    }
                    putchar(10);
                    iVar4 = fflush(_stdout);
                    return iVar4;
                  }
                  pcVar12 = "More data than expected in %s\n";
                  lVar16 = 0x12f;
                }
                else {
                  pcVar12 = "fread(%s) (densitydata) failed\n";
                  lVar16 = 0x129;
                }
              }
              else {
                pcVar12 = "fread(%s) (total #floats) failed\n";
                lVar16 = 0x10c;
              }
            }
            else {
              pcVar12 = "fread(%s) (feature-lengths) failed\n";
              lVar16 = 0x104;
            }
          }
          else {
            pcVar12 = "fread(%s) (#density/codebook) failed\n";
            lVar16 = 0xfc;
          }
        }
        else {
          pcVar12 = "fread(%s) (#features) failed\n";
          lVar16 = 0xf6;
        }
      }
      else {
        pcVar12 = "fread(%s) (#codebooks) failed\n";
        lVar16 = 0xf1;
      }
    }
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/ms_gauden.c"
            ,lVar16,pcVar12,local_88);
  }
LAB_001165f4:
  exit(1);
}

Assistant:

static int32
gauden_param_read(vector_t **** out_param,      /* Alloc space iff *out_param == NULL */
                  int32 * out_n_mgau,
                  int32 * out_n_feat,
                  int32 * out_n_density,
                  int32 ** out_veclen, const char *file_name)
{
    char tmp;
    FILE *fp;
    int32 i, j, k, l, n, blk;
    int32 n_mgau;
    int32 n_feat;
    int32 n_density;
    int32 *veclen;
    int32 byteswap, chksum_present;
    vector_t ***out;
    float32 *buf;
    char **argname, **argval;
    uint32 chksum;

    E_INFO("Reading mixture gaussian parameter: %s\n", file_name);

    if ((fp = fopen(file_name, "rb")) == NULL)
        E_FATAL_SYSTEM("fopen(%s,rb) failed\n", file_name);

    /* Read header, including argument-value info and 32-bit byteorder magic */
    if (bio_readhdr(fp, &argname, &argval, &byteswap) < 0)
        E_FATAL("bio_readhdr(%s) failed\n", file_name);

    /* Parse argument-value list */
    chksum_present = 0;
    for (i = 0; argname[i]; i++) {
        if (strcmp(argname[i], "version") == 0) {
            if (strcmp(argval[i], GAUDEN_PARAM_VERSION) != 0)
                E_WARN("Version mismatch(%s): %s, expecting %s\n",
                       file_name, argval[i], GAUDEN_PARAM_VERSION);
        }
        else if (strcmp(argname[i], "chksum0") == 0) {
            chksum_present = 1; /* Ignore the associated value */
        }
    }
    bio_hdrarg_free(argname, argval);
    argname = argval = NULL;

    chksum = 0;

    /* #Codebooks */
    if (bio_fread(&n_mgau, sizeof(int32), 1, fp, byteswap, &chksum) != 1)
        E_FATAL("fread(%s) (#codebooks) failed\n", file_name);
    *out_n_mgau = n_mgau;

    /* #Features/codebook */
    if (bio_fread(&n_feat, sizeof(int32), 1, fp, byteswap, &chksum) != 1)
        E_FATAL("fread(%s) (#features) failed\n", file_name);
    *out_n_feat = n_feat;

    /* #Gaussian densities/feature in each codebook */
    if (bio_fread(&n_density, sizeof(int32), 1, fp, byteswap, &chksum) !=
        1)
        E_FATAL("fread(%s) (#density/codebook) failed\n", file_name);
    *out_n_density = n_density;

    /* #Dimensions in each feature stream */
    veclen = ckd_calloc(n_feat, sizeof(uint32));
    *out_veclen = veclen;
    if (bio_fread(veclen, sizeof(int32), n_feat, fp, byteswap, &chksum) !=
        n_feat)
        E_FATAL("fread(%s) (feature-lengths) failed\n", file_name);

    /* blk = total vector length of all feature streams */
    for (i = 0, blk = 0; i < n_feat; i++)
        blk += veclen[i];

    /* #Floats to follow; for the ENTIRE SET of CODEBOOKS */
    if (bio_fread(&n, sizeof(int32), 1, fp, byteswap, &chksum) != 1)
        E_FATAL("fread(%s) (total #floats) failed\n", file_name);
    if (n != n_mgau * n_density * blk) {
        E_FATAL
            ("%s: #float32s(%d) doesn't match dimensions: %d x %d x %d\n",
             file_name, n, n_mgau, n_density, blk);
    }

    /* Allocate memory for mixture gaussian densities if not already allocated */
    if (!(*out_param)) {
        out = (vector_t ***) ckd_calloc_3d(n_mgau, n_feat, n_density,
                                           sizeof(vector_t));
        buf = (float32 *) ckd_calloc(n, sizeof(float));
        for (i = 0, l = 0; i < n_mgau; i++) {
            for (j = 0; j < n_feat; j++) {
                for (k = 0; k < n_density; k++) {
                    out[i][j][k] = &buf[l];

                    l += veclen[j];
                }
            }
        }
    }
    else {
        out = *out_param;
        buf = out[0][0][0];
    }

    /* Read mixture gaussian densities data */
    if (bio_fread(buf, sizeof(float32), n, fp, byteswap, &chksum) != n)
        E_FATAL("fread(%s) (densitydata) failed\n", file_name);

    if (chksum_present)
        bio_verify_chksum(fp, byteswap, chksum);

    if (fread(&tmp, 1, 1, fp) == 1)
        E_FATAL("More data than expected in %s\n", file_name);

    fclose(fp);

    *out_param = out;

    E_INFO("%d codebook, %d feature, size\n", n_mgau, n_feat);
    for (i = 0; i < n_feat; i++)
        printf(" %dx%d", n_density, veclen[i]);
    printf("\n");
    fflush(stdout);

    return 0;
}